

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall
cfd::core::Psbt::SetTxOutData(Psbt *this,uint32_t index,Script *redeem_script,KeyData *key)

{
  initializer_list<cfd::core::KeyData> __l;
  KeyData *local_1e0;
  allocator<cfd::core::KeyData> local_1b5 [13];
  KeyData *local_1a8;
  KeyData local_1a0;
  undefined1 local_50 [48];
  KeyData *key_local;
  Script *redeem_script_local;
  Psbt *pPStack_10;
  uint32_t index_local;
  Psbt *this_local;
  
  local_1a8 = &local_1a0;
  local_50._40_8_ = key;
  key_local = (KeyData *)redeem_script;
  redeem_script_local._4_4_ = index;
  pPStack_10 = this;
  KeyData::KeyData(local_1a8,key);
  local_50._0_8_ = &local_1a0;
  local_50._8_8_ = (pointer)0x1;
  ::std::allocator<cfd::core::KeyData>::allocator(local_1b5);
  __l._M_len = local_50._8_8_;
  __l._M_array = (iterator)local_50._0_8_;
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)(local_50 + 0x10),
             __l,local_1b5);
  SetTxOutData(this,index,redeem_script,
               (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)(local_50 + 0x10))
  ;
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)(local_50 + 0x10));
  ::std::allocator<cfd::core::KeyData>::~allocator(local_1b5);
  local_1e0 = (KeyData *)local_50;
  do {
    local_1e0 = local_1e0 + -1;
    KeyData::~KeyData(local_1e0);
  } while (local_1e0 != &local_1a0);
  return;
}

Assistant:

void Psbt::SetTxOutData(
    uint32_t index, const Script &redeem_script, const KeyData &key) {
  SetTxOutData(index, redeem_script, std::vector<KeyData>{key});
}